

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O3

void phosg::parallel_range_thread_fn<unsigned_long>
               (function<bool_(unsigned_long,_unsigned_long)> *fn,
               atomic<unsigned_long> *current_value,atomic<unsigned_long> *result_value,
               unsigned_long end_value,size_t thread_num)

{
  bool bVar1;
  ulong uVar2;
  size_t local_40;
  __atomic_base<unsigned_long> local_38;
  
  LOCK();
  uVar2 = (current_value->super___atomic_base<unsigned_long>)._M_i;
  (current_value->super___atomic_base<unsigned_long>)._M_i =
       (current_value->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (uVar2 < end_value) {
    do {
      local_40 = thread_num;
      local_38._M_i = uVar2;
      if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      bVar1 = (*fn->_M_invoker)((_Any_data *)fn,&local_38._M_i,&local_40);
      if (bVar1) {
        LOCK();
        (result_value->super___atomic_base<unsigned_long>)._M_i = uVar2;
        UNLOCK();
        LOCK();
        (current_value->super___atomic_base<unsigned_long>)._M_i = end_value;
        UNLOCK();
      }
      LOCK();
      uVar2 = (current_value->super___atomic_base<unsigned_long>)._M_i;
      (current_value->super___atomic_base<unsigned_long>)._M_i =
           (current_value->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
    } while (uVar2 < end_value);
  }
  return;
}

Assistant:

void parallel_range_thread_fn(
    std::function<bool(IntT, size_t thread_num)>& fn,
    std::atomic<IntT>& current_value,
    std::atomic<IntT>& result_value,
    IntT end_value,
    size_t thread_num) {
  IntT v;
  while ((v = current_value.fetch_add(1)) < end_value) {
    if (fn(v, thread_num)) {
      result_value = v;
      current_value = end_value;
    }
  }
}